

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O1

int isoent_add_child_head(isoent *parent,isoent *child)

{
  int *piVar1;
  int iVar2;
  isoent *piVar3;
  
  iVar2 = __archive_rb_tree_insert_node(&parent->rbtree,&child->rbnode);
  if (iVar2 != 0) {
    piVar3 = (parent->children).first;
    child->chnext = piVar3;
    if (piVar3 == (isoent *)0x0) {
      piVar3 = (isoent *)&child->chnext;
      (parent->children).last = (isoent **)piVar3;
    }
    iVar2 = (int)piVar3;
    (parent->children).first = child;
    piVar1 = &(parent->children).cnt;
    *piVar1 = *piVar1 + 1;
    child->parent = parent;
    if ((child->field_0xe8 & 2) == 0) {
      child->drnext = (isoent *)0x0;
    }
    else {
      piVar3 = (parent->subdirs).first;
      child->drnext = piVar3;
      if (piVar3 == (isoent *)0x0) {
        piVar3 = (isoent *)&child->drnext;
        (parent->subdirs).last = (isoent **)piVar3;
      }
      iVar2 = (int)piVar3;
      (parent->subdirs).first = child;
      piVar1 = &(parent->subdirs).cnt;
      *piVar1 = *piVar1 + 1;
      child->parent = parent;
    }
  }
  return iVar2;
}

Assistant:

static int
isoent_add_child_head(struct isoent *parent, struct isoent *child)
{

	if (!__archive_rb_tree_insert_node(
	    &(parent->rbtree), (struct archive_rb_node *)child))
		return (0);
	if ((child->chnext = parent->children.first) == NULL)
		parent->children.last = &(child->chnext);
	parent->children.first = child;
	parent->children.cnt++;
	child->parent = parent;

	/* Add a child to a sub-directory chain */
	if (child->dir) {
		if ((child->drnext = parent->subdirs.first) == NULL)
			parent->subdirs.last = &(child->drnext);
		parent->subdirs.first = child;
		parent->subdirs.cnt++;
		child->parent = parent;
	} else
		child->drnext = NULL;
	return (1);
}